

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::skip_group_mods(CVmPackPos *p,CVmPackType *gt)

{
  wchar_t wVar1;
  CVmPackPos *in_RSI;
  wchar_t close_paren;
  wchar_t c;
  wchar_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  undefined4 uVar3;
  
  wVar1 = CVmPackPos::getch((CVmPackPos *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (wVar1 == L'(') {
    uVar2 = 0x29;
  }
  else if (wVar1 == L'[') {
    in_stack_ffffffffffffffe0 = 0x5d;
    uVar2 = in_stack_ffffffffffffffe0;
  }
  else {
    in_stack_ffffffffffffffe0 = 0;
    uVar2 = in_stack_ffffffffffffffe0;
    if (wVar1 == L'{') {
      in_stack_ffffffffffffffe0 = 0x7d;
      uVar2 = in_stack_ffffffffffffffe0;
    }
  }
  uVar3 = uVar2;
  CVmPackPos::inc((CVmPackPos *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  skip_group((CVmPackPos *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  CVmPackPos::inc((CVmPackPos *)CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  parse_mods(in_RSI,(CVmPackType *)CONCAT44(wVar1,uVar3));
  return;
}

Assistant:

void CVmPack::skip_group_mods(CVmPackPos *p, CVmPackType *gt)
{
    /* note the close paren type we're looking for */
    wchar_t c = p->getch();
    wchar_t close_paren = (c == '(' ? ')' :
                           c == '[' ? ']' :
                           c == '{' ? '}' :
                           0);

    /* skip to the close paren */
    p->inc();
    skip_group(p, close_paren);

    /* skip the close paren */
    p->inc();

    /* parse the group modifiers */
    parse_mods(p, gt);
}